

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O3

xr_reader * __thiscall xray_re::xr_file_system::r_open(xr_file_system *this,char *path,char *name)

{
  pointer pcVar1;
  path_alias *ppVar2;
  xr_reader *pxVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_40 [2];
  long local_30 [2];
  
  ppVar2 = find_path_alias(this,path);
  if (ppVar2 == (path_alias *)0x0) {
    pxVar3 = (xr_reader *)0x0;
  }
  else {
    pcVar1 = (ppVar2->root)._M_dataplus._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar1,pcVar1 + (ppVar2->root)._M_string_length);
    std::__cxx11::string::append((char *)local_40);
    pxVar3 = r_open(this,(char *)local_40[0]);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return pxVar3;
}

Assistant:

xr_reader* xr_file_system::r_open(const char* path, const char* name) const
{
	const path_alias* pa = find_path_alias(path);
	return pa ? r_open(pa->root + name) : 0;
}